

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_verify.cpp
# Opt level: O0

int64_t GetTransactionSigOpCost(CTransaction *tx,CCoinsViewCache *inputs,uint32_t flags)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  const_reference pvVar5;
  size_t sVar6;
  uint in_EDX;
  long in_FS_OFFSET;
  uint in_stack_00000024;
  CScriptWitness *in_stack_00000028;
  CTxOut *prevout;
  Coin *coin;
  uint i;
  int64_t nSigOps;
  Coin *in_stack_ffffffffffffff88;
  COutPoint *in_stack_ffffffffffffff90;
  CCoinsViewCache *in_stack_ffffffffffffff98;
  CCoinsViewCache *in_stack_ffffffffffffffb8;
  CTransaction *in_stack_ffffffffffffffc0;
  uint local_34;
  ulong local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = GetLegacySigOpCount((CTransaction *)in_stack_ffffffffffffffb8);
  local_30 = (ulong)(uVar3 << 2);
  bVar2 = CTransaction::IsCoinBase((CTransaction *)in_stack_ffffffffffffff98);
  if (!bVar2) {
    if ((in_EDX & 1) != 0) {
      uVar3 = GetP2SHSigOpCount(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      local_30 = (uVar3 << 2) + local_30;
    }
    for (local_34 = 0;
        sVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                          ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff88),
        local_34 < sVar4; local_34 = local_34 + 1) {
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff98,
                 (size_type)in_stack_ffffffffffffff90);
      CCoinsViewCache::AccessCoin(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      bVar2 = Coin::IsSpent(in_stack_ffffffffffffff88);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        __assert_fail("!coin.IsSpent()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/consensus/tx_verify.cpp"
                      ,0x9d,
                      "int64_t GetTransactionSigOpCost(const CTransaction &, const CCoinsViewCache &, uint32_t)"
                     );
      }
      pvVar5 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                         ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff98,
                          (size_type)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff98 = (CCoinsViewCache *)&pvVar5->scriptSig;
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffff98,
                 (size_type)in_stack_ffffffffffffff90);
      sVar6 = CountWitnessSigOps((CScript *)coin,(CScript *)prevout,in_stack_00000028,
                                 in_stack_00000024);
      local_30 = sVar6 + local_30;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

int64_t GetTransactionSigOpCost(const CTransaction& tx, const CCoinsViewCache& inputs, uint32_t flags)
{
    int64_t nSigOps = GetLegacySigOpCount(tx) * WITNESS_SCALE_FACTOR;

    if (tx.IsCoinBase())
        return nSigOps;

    if (flags & SCRIPT_VERIFY_P2SH) {
        nSigOps += GetP2SHSigOpCount(tx, inputs) * WITNESS_SCALE_FACTOR;
    }

    for (unsigned int i = 0; i < tx.vin.size(); i++)
    {
        const Coin& coin = inputs.AccessCoin(tx.vin[i].prevout);
        assert(!coin.IsSpent());
        const CTxOut &prevout = coin.out;
        nSigOps += CountWitnessSigOps(tx.vin[i].scriptSig, prevout.scriptPubKey, &tx.vin[i].scriptWitness, flags);
    }
    return nSigOps;
}